

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void average_gf_stats(int total_frame,GF_GROUP_STATS *gf_stats)

{
  GF_GROUP_STATS *gf_stats_local;
  int total_frame_local;
  
  if (total_frame != 0) {
    gf_stats->avg_sr_coded_error = gf_stats->avg_sr_coded_error / (double)total_frame;
    gf_stats->avg_pcnt_second_ref = gf_stats->avg_pcnt_second_ref / (double)total_frame;
    gf_stats->avg_new_mv_count = gf_stats->avg_new_mv_count / (double)total_frame;
    gf_stats->avg_wavelet_energy = gf_stats->avg_wavelet_energy / (double)total_frame;
  }
  if (gf_stats->non_zero_stdev_count != 0) {
    gf_stats->avg_raw_err_stdev =
         gf_stats->avg_raw_err_stdev / (double)gf_stats->non_zero_stdev_count;
  }
  return;
}

Assistant:

static void average_gf_stats(const int total_frame, GF_GROUP_STATS *gf_stats) {
  if (total_frame) {
    gf_stats->avg_sr_coded_error /= total_frame;
    gf_stats->avg_pcnt_second_ref /= total_frame;
    gf_stats->avg_new_mv_count /= total_frame;
    gf_stats->avg_wavelet_energy /= total_frame;
  }

  if (gf_stats->non_zero_stdev_count)
    gf_stats->avg_raw_err_stdev /= gf_stats->non_zero_stdev_count;
}